

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void Cmd_stopmus(FCommandLine *argv,APlayerPawn *who,int key)

{
  FPlayList *pFVar1;
  
  pFVar1 = PlayList;
  if (PlayList != (FPlayList *)0x0) {
    FPlayList::~FPlayList(PlayList);
    operator_delete(pFVar1,0x18);
    PlayList = (FPlayList *)0x0;
  }
  S_StopMusic(false);
  FString::operator=(&LastSong,(char *)"");
  return;
}

Assistant:

CCMD (stopmus)
{
	if (PlayList)
	{
		delete PlayList;
		PlayList = NULL;
	}
	S_StopMusic (false);
	LastSong = "";	// forget the last played song so that it won't get restarted if some volume changes occur
}